

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorBits.c
# Opt level: O0

void PrepareBitSetModule(void)

{
  int local_10;
  int nLimit;
  int k;
  int i;
  
  for (nLimit = 0; nLimit < 0x10000; nLimit = nLimit + 1) {
    BitCount[nLimit] = BitCount8[(int)(nLimit & 0xff)] + BitCount8[nLimit >> 8];
    BitGroupNumbers[nLimit] = 200;
  }
  for (local_10 = 0; local_10 < 0xa3; local_10 = local_10 + 1) {
    BitGroupNumbers[SparseNumbers[local_10]] = (uchar)local_10;
  }
  return;
}

Assistant:

void PrepareBitSetModule()
// this function should be called before anything is done with the cube cover
{   
    // prepare bit count
    int i, k;
    int nLimit;
    
    nLimit = FULL16BITS;
    for ( i = 0; i < nLimit; i++ )
    {
        BitCount[i] = BitCount8[ i & 0xff ] + BitCount8[ i>>8 ];
        BitGroupNumbers[i] = MARKNUMBER;
    }
    // prepare bit groups
    for ( k = 0; k < 163; k++ )
        BitGroupNumbers[ SparseNumbers[k] ] = k;
/*
    // verify bit groups
    int n = 4368;
    char Buff[100];
    cout << "The number is " << n << endl;
    cout << "The binary is " << itoa(n,Buff,2) << endl;
    cout << "BitGroupNumbers[n] is " << (int)BitGroupNumbers[n] << endl;
    cout << "The group literals are ";
    for ( int g = 0; g < 4; g++ )
        cout << " " << (int)GroupLiterals[BitGroupNumbers[n]][g];
*/
}